

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dnn.cpp
# Opt level: O2

void __thiscall tfs::Dnn::clear(Dnn *this)

{
  pointer ppDVar1;
  pointer ppDVar2;
  
  this->m_layer_output = (DnnLayer *)0x0;
  this->m_layer_input = (DnnLayerInput *)0x0;
  this->m_layer_previous = (DnnLayer *)0x0;
  ppDVar1 = (this->m_layers).super__Vector_base<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppDVar2 = (this->m_layers).
                 super__Vector_base<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppDVar2 != ppDVar1; ppDVar2 = ppDVar2 + 1) {
    if (*ppDVar2 != (DnnLayer *)0x0) {
      (*(*ppDVar2)->_vptr_DnnLayer[1])();
    }
  }
  ppDVar2 = (this->m_layers).super__Vector_base<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_layers).super__Vector_base<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppDVar2) {
    (this->m_layers).super__Vector_base<tfs::DnnLayer_*,_std::allocator<tfs::DnnLayer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppDVar2;
  }
  return;
}

Assistant:

void
    Dnn::clear( void ) {
        // Delete all of the layers.
        m_layer_input    = 0;
        m_layer_previous = 0;
        m_layer_output   = 0;
        std::vector< DnnLayer* >::const_iterator layer_end = m_layers.end();
        for( std::vector< DnnLayer* >::const_iterator it = m_layers.begin(); it != layer_end; it++ ) {
            DnnLayer *layer = *it;
            delete layer;
        }
        m_layers.clear();
        return;
    }